

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::SizeStatistics::write(SizeStatistics *this,int __fd,void *__buf,size_t __n)

{
  _SizeStatistics__isset _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  pointer plVar6;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar2 = (*this_00->_vptr_TProtocol[4])(this_00,"SizeStatistics");
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"unencoded_byte_array_data_bytes",10,1);
    iVar4 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->unencoded_byte_array_data_bytes);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 2) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"repetition_level_histogram",0xf,2);
    iVar4 = (*this_00->_vptr_TProtocol[0xb])
                      (this_00,10,
                       (ulong)((long)(this->repetition_level_histogram).
                                     super_vector<long,_std::allocator<long>_>.
                                     super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->repetition_level_histogram).
                                    super_vector<long,_std::allocator<long>_>.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
    iVar4 = iVar3 + iVar2 + iVar4;
    for (plVar6 = (this->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        plVar6 != (this->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_finish; plVar6 = plVar6 + 1) {
      iVar2 = (*this_00->_vptr_TProtocol[0x13])(this_00,*plVar6);
      iVar4 = iVar4 + iVar2;
    }
    iVar3 = (*this_00->_vptr_TProtocol[0xc])(this_00);
    iVar2 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar3 + iVar4 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 4) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"definition_level_histogram",0xf,3);
    iVar4 = (*this_00->_vptr_TProtocol[0xb])
                      (this_00,10,
                       (ulong)((long)(this->definition_level_histogram).
                                     super_vector<long,_std::allocator<long>_>.
                                     super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->definition_level_histogram).
                                    super_vector<long,_std::allocator<long>_>.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
    iVar4 = iVar3 + iVar2 + iVar4;
    for (plVar6 = (this->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        plVar6 != (this->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_finish; plVar6 = plVar6 + 1) {
      iVar2 = (*this_00->_vptr_TProtocol[0x13])(this_00,*plVar6);
      iVar4 = iVar4 + iVar2;
    }
    iVar3 = (*this_00->_vptr_TProtocol[0xc])(this_00);
    iVar2 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar3 + iVar4 + iVar2;
  }
  iVar3 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar3 + iVar2 + iVar4);
}

Assistant:

uint32_t SizeStatistics::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("SizeStatistics");

  if (this->__isset.unencoded_byte_array_data_bytes) {
    xfer += oprot->writeFieldBegin("unencoded_byte_array_data_bytes", ::apache::thrift::protocol::T_I64, 1);
    xfer += oprot->writeI64(this->unencoded_byte_array_data_bytes);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.repetition_level_histogram) {
    xfer += oprot->writeFieldBegin("repetition_level_histogram", ::apache::thrift::protocol::T_LIST, 2);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_I64, static_cast<uint32_t>(this->repetition_level_histogram.size()));
      duckdb::vector<int64_t> ::const_iterator _iter10;
      for (_iter10 = this->repetition_level_histogram.begin(); _iter10 != this->repetition_level_histogram.end(); ++_iter10)
      {
        xfer += oprot->writeI64((*_iter10));
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.definition_level_histogram) {
    xfer += oprot->writeFieldBegin("definition_level_histogram", ::apache::thrift::protocol::T_LIST, 3);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_I64, static_cast<uint32_t>(this->definition_level_histogram.size()));
      duckdb::vector<int64_t> ::const_iterator _iter11;
      for (_iter11 = this->definition_level_histogram.begin(); _iter11 != this->definition_level_histogram.end(); ++_iter11)
      {
        xfer += oprot->writeI64((*_iter11));
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}